

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

var cs::function::call_rr(function *_this,vector *args)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  element_type *peVar6;
  var *this;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  long in_RSI;
  proxy *in_RDI;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  const_iterator __end1;
  const_iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  size_t i;
  fcall_guard fcall;
  scope_guard scope;
  _Self *in_stack_fffffffffffffdc8;
  process_context *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  var *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  domain_manager *in_stack_fffffffffffffec0;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_110;
  long local_f0;
  ulong local_e8;
  undefined1 local_c9;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  process_context::poll_event(in_stack_fffffffffffffdd0);
  sVar3 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(local_18);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_10 + 0x18));
  if (sVar3 != sVar4) {
    local_c9 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_10 + 0x18));
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe08);
    std::operator+((char *)in_stack_fffffffffffffdd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdd0);
    std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(local_18);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe08);
    std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    runtime_error::runtime_error
              ((runtime_error *)in_stack_fffffffffffffdd0,(string *)in_stack_fffffffffffffdc8);
    local_c9 = 0;
    __cxa_throw(uVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  scope_guard::scope_guard
            ((scope_guard *)in_stack_fffffffffffffdd0,(context_t *)in_stack_fffffffffffffdc8);
  fcall_guard::fcall_guard((fcall_guard *)0x1d9820);
  local_e8 = 0;
  while( true ) {
    uVar1 = local_e8;
    sVar3 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(local_18);
    if (sVar3 <= uVar1) break;
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d9866);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d9872);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_10 + 0x18),local_e8);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](local_18,local_e8);
    domain_manager::add_var_no_return<std::__cxx11::string_const&>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    local_e8 = local_e8 + 1;
  }
  local_f0 = local_10 + 0x30;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffdc8);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffdc8);
  do {
    bVar2 = std::operator!=((_Self *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    if (!bVar2) {
      this = fcall_guard::get((fcall_guard *)0x1d9cb9);
      cs_impl::any::any(this,(any *)in_stack_fffffffffffffdc8);
LAB_001d9cdc:
      fcall_guard::~fcall_guard((fcall_guard *)0x1d9ce9);
      scope_guard::~scope_guard((scope_guard *)0x1d9cf6);
      return (var)in_RDI;
    }
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator*(&local_110);
    statement_base::run((statement_base *)in_stack_fffffffffffffdd0);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d9c31);
    peVar6 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d9c3d);
    if ((peVar6->return_fcall & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1d9c53);
      peVar6 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d9c5f);
      peVar6->return_fcall = false;
      fcall_guard::get((fcall_guard *)0x1d9c73);
      cs_impl::any::any((any *)in_stack_fffffffffffffdd0,(any *)in_stack_fffffffffffffdc8);
      goto LAB_001d9cdc;
    }
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
                  *)in_stack_fffffffffffffdd0);
  } while( true );
}

Assistant:

var function::call_rr(const function *_this, vector &args)
	{
		current_process->poll_event();
		if (args.size() != _this->mArgs.size())
			throw runtime_error(
			    "Wrong size of arguments. Expected " + std::to_string(_this->mArgs.size()) + ", provided " +
			    std::to_string(args.size()));
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#else
		fcall_guard fcall;
#endif
		for (std::size_t i = 0; i < args.size(); ++i)
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs[i], args[i]);
		for (auto &ptr: _this->mBody) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
			if (_this->mContext->instance->return_fcall) {
				_this->mContext->instance->return_fcall = false;
				return fcall.get();
			}
		}
		return fcall.get();
	}